

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void Js::DynamicProfileInfo::DumpProfiledValue
               (char16 *name,ImplicitCallFlags *loopImplicitCallFlags,uint count)

{
  char16_t *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    uVar2 = 0;
    do {
      uVar3 = 0;
      pcVar1 = L" ";
      if (uVar2 != 0) {
        pcVar1 = L"\n                          ";
        if ((int)((uVar2 & 0xffffffff) / 10) * -10 + (int)uVar2 != 0) {
          pcVar1 = L" ";
        }
        uVar3 = uVar2 & 0xffffffff;
      }
      Output::Print(pcVar1);
      pcVar1 = L"Implicit call: no";
      if ((loopImplicitCallFlags[uVar2] & ImplicitCall_All) != ImplicitCall_None) {
        pcVar1 = L"Implicit call: yes";
      }
      if ((loopImplicitCallFlags[uVar2] & ImplicitCall_All) == ImplicitCall_HasNoInfo) {
        pcVar1 = L"Implicit call: ???";
      }
      Output::Print(L"%2d:%-4s",uVar3,pcVar1 + 0xf);
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ImplicitCallFlags * loopImplicitCallFlags, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:%-4s"), i, GetImplicitCallFlagsString(loopImplicitCallFlags[i]));
            }
            Output::Print(_u("\n"));
        }
    }